

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O0

int __thiscall
btTriangleMesh::findOrAddVertex(btTriangleMesh *this,btVector3 *vertex,bool removeDuplicateVertices)

{
  int iVar1;
  int iVar2;
  btIndexedMesh *pbVar3;
  btVector3 *pbVar4;
  float *pfVar5;
  float *_y;
  float *_z;
  byte in_DL;
  btVector3 *in_RSI;
  long in_RDI;
  btAlignedObjectArray<float> *this_00;
  btScalar bVar6;
  btVector3 vtx;
  int i_1;
  int i;
  btVector3 *in_stack_ffffffffffffff58;
  btAlignedObjectArray<btVector3> *in_stack_ffffffffffffff60;
  btVector3 local_44;
  int local_34;
  btScalar local_30 [4];
  int local_20;
  byte local_19;
  btVector3 *local_18;
  int local_4;
  
  local_19 = in_DL & 1;
  if ((*(byte *)(in_RDI + 0xe9) & 1) == 0) {
    local_18 = in_RSI;
    if (local_19 != 0) {
      for (local_34 = 0; iVar1 = local_34,
          iVar2 = btAlignedObjectArray<float>::size((btAlignedObjectArray<float> *)(in_RDI + 0x88)),
          iVar1 < iVar2; local_34 = local_34 + 3) {
        this_00 = (btAlignedObjectArray<float> *)(in_RDI + 0x88);
        pfVar5 = btAlignedObjectArray<float>::operator[](this_00,local_34);
        _y = btAlignedObjectArray<float>::operator[](this_00,local_34 + 1);
        _z = btAlignedObjectArray<float>::operator[](this_00,local_34 + 2);
        btVector3::btVector3(&local_44,pfVar5,_y,_z);
        operator-((btVector3 *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        bVar6 = btVector3::length2((btVector3 *)0x1c9bd1);
        if (bVar6 <= *(float *)(in_RDI + 0xec)) {
          return local_34 / 3;
        }
      }
    }
    btVector3::getX(local_18);
    btAlignedObjectArray<float>::push_back
              ((btAlignedObjectArray<float> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58->m_floats);
    btVector3::getY(local_18);
    btAlignedObjectArray<float>::push_back
              ((btAlignedObjectArray<float> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58->m_floats);
    pfVar5 = (float *)(in_RDI + 0x88);
    btVector3::getZ(local_18);
    btAlignedObjectArray<float>::push_back
              ((btAlignedObjectArray<float> *)in_stack_ffffffffffffff60,pfVar5);
    pbVar3 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 0x18),0);
    pbVar3->m_numVertices = pbVar3->m_numVertices + 1;
    pfVar5 = btAlignedObjectArray<float>::operator[]
                       ((btAlignedObjectArray<float> *)(in_RDI + 0x88),0);
    pbVar3 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 0x18),0);
    pbVar3->m_vertexBase = (uchar *)pfVar5;
    local_4 = btAlignedObjectArray<float>::size((btAlignedObjectArray<float> *)(in_RDI + 0x88));
    local_4 = local_4 / 3;
  }
  else {
    if (local_19 != 0) {
      for (local_20 = 0; iVar1 = local_20,
          iVar2 = btAlignedObjectArray<btVector3>::size
                            ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x68)), iVar1 < iVar2;
          local_20 = local_20 + 1) {
        btAlignedObjectArray<btVector3>::operator[]
                  ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x68),local_20);
        local_30 = (btScalar  [4])
                   operator-((btVector3 *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        bVar6 = btVector3::length2((btVector3 *)0x1c9a40);
        if (bVar6 <= *(float *)(in_RDI + 0xec)) {
          return local_20;
        }
      }
    }
    pbVar3 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 0x18),0);
    pbVar3->m_numVertices = pbVar3->m_numVertices + 1;
    btAlignedObjectArray<btVector3>::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    pbVar4 = btAlignedObjectArray<btVector3>::operator[]
                       ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x68),0);
    pbVar3 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 0x18),0);
    pbVar3->m_vertexBase = (uchar *)pbVar4;
    local_4 = btAlignedObjectArray<btVector3>::size
                        ((btAlignedObjectArray<btVector3> *)(in_RDI + 0x68));
  }
  local_4 = local_4 + -1;
  return local_4;
}

Assistant:

int	btTriangleMesh::findOrAddVertex(const btVector3& vertex, bool removeDuplicateVertices)
{
	//return index of new/existing vertex
	///@todo: could use acceleration structure for this
	if (m_use4componentVertices)
	{
		if (removeDuplicateVertices)
			{
			for (int i=0;i< m_4componentVertices.size();i++)
			{
				if ((m_4componentVertices[i]-vertex).length2() <= m_weldingThreshold)
				{
					return i;
				}
			}
		}
		m_indexedMeshes[0].m_numVertices++;
		m_4componentVertices.push_back(vertex);
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_4componentVertices[0];

		return m_4componentVertices.size()-1;
		
	} else
	{
		
		if (removeDuplicateVertices)
		{
			for (int i=0;i< m_3componentVertices.size();i+=3)
			{
				btVector3 vtx(m_3componentVertices[i],m_3componentVertices[i+1],m_3componentVertices[i+2]);
				if ((vtx-vertex).length2() <= m_weldingThreshold)
				{
					return i/3;
				}
			}
		}
		m_3componentVertices.push_back(vertex.getX());
		m_3componentVertices.push_back(vertex.getY());
		m_3componentVertices.push_back(vertex.getZ());
		m_indexedMeshes[0].m_numVertices++;
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_3componentVertices[0];
		return (m_3componentVertices.size()/3)-1;
	}

}